

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O3

aiScene * __thiscall Assimp::Importer::GetOrphanedScene(Importer *this)

{
  aiScene *paVar1;
  
  paVar1 = this->pimpl->mScene;
  this->pimpl->mScene = (aiScene *)0x0;
  std::__cxx11::string::_M_replace
            ((ulong)&this->pimpl->mErrorString,0,
             (char *)(this->pimpl->mErrorString)._M_string_length,0x68cee4);
  return paVar1;
}

Assistant:

aiScene* Importer::GetOrphanedScene()
{
    aiScene* s = pimpl->mScene;

    ASSIMP_BEGIN_EXCEPTION_REGION();
    pimpl->mScene = NULL;

    pimpl->mErrorString = ""; /* reset error string */
    ASSIMP_END_EXCEPTION_REGION(aiScene*);
    return s;
}